

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  EventLoop *this;
  char *str;
  LogLevel LVar1;
  sz_pid_t sVar2;
  int iVar3;
  int mode_00;
  LogStream *pLVar4;
  self *psVar5;
  SourceFile file;
  int local_1288;
  undefined1 local_1250 [8];
  EchoServer server;
  undefined1 local_10e4 [8];
  InetAddress listenAddr;
  EventLoop loop;
  int mode;
  uint16_t sSvrPort;
  char *szSvrip;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_ff8,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/tcp_echo/tcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    sznet::Logger::Logger(&local_fe8,file,0x81);
    pLVar4 = sznet::Logger::stream(&local_fe8);
    psVar5 = sznet::LogStream::operator<<(pLVar4,"pid = ");
    sVar2 = sznet::sz_getpid();
    pLVar4 = sznet::LogStream::operator<<(psVar5,sVar2);
    psVar5 = sznet::LogStream::operator<<(pLVar4,", tid = ");
    sVar2 = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar5,sVar2);
    sznet::Logger::~Logger(&local_fe8);
  }
  if ((int)argv_local < 5) {
    printf("Usage: %s ip port thread_num mode(1-echo, others-RTT)\n",*local_18);
    argv_local._4_4_ = 0;
  }
  else {
    str = local_18[1];
    iVar3 = atoi(local_18[2]);
    local_1288 = atoi(local_18[3]);
    if (local_1288 == 0) {
      local_1288 = 2;
    }
    numThreads = local_1288;
    mode_00 = atoi(local_18[4]);
    this = (EventLoop *)((long)&listenAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc);
    sznet::net::EventLoop::EventLoop(this);
    g_pMainLoopsRun = this;
    sznet::StringArg::StringArg((StringArg *)&server.m_mode,str);
    sznet::net::InetAddress::InetAddress
              ((InetAddress *)local_10e4,(StringArg)server._344_8_,(uint16_t)iVar3,false);
    EchoServer::EchoServer
              ((EchoServer *)local_1250,
               (EventLoop *)((long)&listenAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc),
               (InetAddress *)local_10e4,mode_00);
    EchoServer::start((EchoServer *)local_1250);
    sznet::net::EventLoop::loop
              ((EventLoop *)((long)&listenAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc));
    argv_local._4_4_ = 0;
    EchoServer::~EchoServer((EchoServer *)local_1250);
    sznet::net::EventLoop::~EventLoop
              ((EventLoop *)((long)&listenAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc));
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();
    if (argc <= 4)
    {
        printf("Usage: %s ip port thread_num mode(1-echo, others-RTT)\n", argv[0]);
        return 0;
    }

    char* szSvrip = argv[1];
    uint16_t sSvrPort= static_cast<uint16_t>(atoi(argv[2]));
    numThreads = atoi(argv[3]);
    numThreads = (numThreads == 0 ? 2 : numThreads);
    int mode = atoi(argv[4]);

    EventLoop loop;
    g_pMainLoopsRun = &loop;
    InetAddress listenAddr(szSvrip, sSvrPort);
    EchoServer server(&loop, listenAddr, mode);

    server.start();

    loop.loop();

    return 0;
}